

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

istream * __thiscall amrex::DistributionMapping::readFrom(DistributionMapping *this,istream *is)

{
  element_type *peVar1;
  pointer piVar2;
  istream *this_00;
  int *x;
  pointer piVar3;
  int n;
  int local_1c;
  
  peVar1 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar3 = *(pointer *)
            &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (*(pointer *)
       ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar3) {
    *(pointer *)
     ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar3;
  }
  piVar3 = (peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar3) {
    *(pointer *)
     ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar3;
  }
  (((_Bit_iterator *)
   ((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p =
       *(_Bit_type **)
        &(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start;
  *(uint *)((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data + 0x18) = 0;
  peVar1 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (istream *)std::istream::ignore((long)is,100000);
  std::istream::operator>>(this_00,&local_1c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)peVar1,(long)local_1c);
  piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&peVar1->m_pmap)->_M_impl).
           super__Vector_impl_data._M_finish;
  for (piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&peVar1->m_pmap)->_M_impl).
                super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
    std::istream::operator>>((istream *)is,piVar3);
  }
  std::istream::ignore((long)is,100000);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("DistributionMapping::readFrom(istream&) failed");
  }
  return is;
}

Assistant:

std::istream&
DistributionMapping::readFrom (std::istream& is)
{
    AMREX_ASSERT(size() == 0);
    m_ref->clear();
    auto& pmap = m_ref->m_pmap;

    int n;
    is.ignore(100000, '(') >> n;
    pmap.resize(n);
    for (auto& x : pmap) {
        is >> x;
    }
    is.ignore(100000, ')');
    if (is.fail()) {
        amrex::Error("DistributionMapping::readFrom(istream&) failed");
    }
    return is;
}